

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O1

QString * __thiscall
QCommonStylePrivate::toolButtonElideText
          (QString *__return_storage_ptr__,QCommonStylePrivate *this,QStyleOptionToolButton *option,
          QRect *textRect,int flags)

{
  Data *pDVar1;
  int iVar2;
  QCommonStylePrivate *this_00;
  long in_FS_OFFSET;
  QTextOption textOption;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QFontMetrics::horizontalAdvance
                    ((QString *)&(option->super_QStyleOptionComplex).super_QStyleOption.fontMetrics,
                     (int)option + 0x60);
  if (((textRect->x2).m_i - (textRect->x1).m_i) + 1 < iVar2) {
    local_58.d.d = (option->text).d.d;
    local_58.d.ptr = (option->text).d.ptr;
    local_58.d.size = (option->text).d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this_00 = (QCommonStylePrivate *)&DAT_0000000a;
    QString::replace((QChar)(char16_t)&local_58,(QChar)0xa,0x2028);
    _textOption = &DAT_aaaaaaaaaaaaaaaa;
    QTextOption::QTextOption(&textOption);
    _textOption = (undefined1 *)
                  CONCAT44((int)((ulong)_textOption >> 0x20),
                           _textOption & 0xffff21ff | 0x400 |
                           ((option->super_QStyleOptionComplex).super_QStyleOption.direction &
                           (LayoutDirectionAuto|RightToLeft)) << 0xe);
    calculateElidedText(__return_storage_ptr__,this_00,&local_58,&textOption,&option->font,textRect,
                        (Alignment)0x20,ElideMiddle,flags,false,(QPointF *)0x0);
    QTextOption::~QTextOption(&textOption);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pDVar1 = (option->text).d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (option->text).d.ptr;
    (__return_storage_ptr__->d).size = (option->text).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommonStylePrivate::toolButtonElideText(const QStyleOptionToolButton *option,
                                                 const QRect &textRect, int flags) const
{
    if (option->fontMetrics.horizontalAdvance(option->text) <= textRect.width())
        return option->text;

    QString text = option->text;
    text.replace(u'\n', QChar::LineSeparator);
    QTextOption textOption;
    textOption.setWrapMode(QTextOption::ManualWrap);
    textOption.setTextDirection(option->direction);

    return calculateElidedText(text, textOption,
                               option->font, textRect, Qt::AlignTop,
                               Qt::ElideMiddle, flags,
                               false, nullptr);
}